

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

void secp256k1_scalar_from_signed62(secp256k1_scalar *r,secp256k1_modinv64_signed62 *a)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int64_t iVar7;
  int64_t iVar8;
  ulong uVar9;
  int64_t *piVar10;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  uint uVar11;
  secp256k1_modinv64_signed62 *in_RCX;
  ulong uVar12;
  secp256k1_modinv64_signed62 *psVar13;
  ulong uVar14;
  ulong *extraout_RDX;
  int64_t *a_00;
  long lVar15;
  long lVar16;
  int64_t *a_01;
  long lVar17;
  int64_t *piVar18;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  secp256k1_modinv64_signed62 *a_02;
  long *extraout_RDX_09;
  long lVar19;
  long lVar20;
  secp256k1_modinv64_signed62 *b;
  undefined8 unaff_RBX;
  int64_t *piVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  int64_t *piVar25;
  secp256k1_modinv64_signed62 *psVar26;
  int64_t *piVar27;
  undefined1 *puVar28;
  secp256k1_modinv64_signed62 *psVar29;
  int64_t *piVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  secp256k1_modinv64_signed62 *psVar34;
  bool bVar35;
  secp256k1_modinv64_signed62 sStack_118;
  secp256k1_modinv64_signed62 sStack_f0;
  int64_t *piStack_c8;
  int64_t *piStack_c0;
  secp256k1_modinv64_signed62 *psStack_b8;
  ulong uStack_b0;
  int64_t *piStack_a8;
  ulong uStack_a0;
  int64_t *piStack_98;
  secp256k1_modinv64_signed62 *psStack_90;
  int64_t *piStack_88;
  long lStack_80;
  long lStack_78;
  int64_t *piStack_70;
  long lStack_68;
  long lStack_60;
  long lStack_58;
  long lStack_50;
  long lStack_48;
  int64_t *piStack_40;
  undefined8 uStack_38;
  
  if ((ulong)a->v[0] >> 0x3e == 0) {
    uVar12 = a->v[1];
    if (0x3fffffffffffffff < uVar12) goto LAB_001459cc;
    uVar23 = a->v[2];
    if (0x3fffffffffffffff < uVar23) goto LAB_001459d1;
    uVar9 = a->v[3];
    if (0x3fffffffffffffff < uVar9) goto LAB_001459d6;
    in_RCX = (secp256k1_modinv64_signed62 *)a->v[4];
    if ((secp256k1_modinv64_signed62 *)0xff < in_RCX) goto LAB_001459db;
    uVar6 = uVar12 << 0x3e | a->v[0];
    uVar14 = uVar23 << 0x3c | uVar12 >> 2;
    uVar23 = uVar9 << 0x3a | uVar23 >> 4;
    uVar12 = (long)in_RCX << 0x38 | uVar9 >> 6;
    unaff_RBX = CONCAT71((int7)((ulong)unaff_RBX >> 8),0xbaaedce6af48a03a < uVar14);
    r->d[0] = uVar6;
    r->d[1] = uVar14;
    r->d[2] = uVar23;
    r->d[3] = uVar12;
    uVar5 = (uint)((0xfffffffffffffffd < uVar23 && uVar12 == 0xffffffffffffffff) &&
                  0xbaaedce6af48a03a < uVar14);
    uVar22 = 0;
    if (0xbaaedce6af48a03b < uVar14) {
      uVar22 = uVar5;
    }
    uVar22 = uVar22 | (uVar23 == 0xffffffffffffffff && uVar12 == 0xffffffffffffffff);
    a = (secp256k1_modinv64_signed62 *)(ulong)uVar22;
    r = (secp256k1_scalar *)0xbfd25e8cd0364140;
    uVar11 = 0;
    if (0xbfd25e8cd0364140 < uVar6) {
      uVar11 = uVar5;
    }
    uVar11 = uVar11 | uVar22;
    in_RCX = (secp256k1_modinv64_signed62 *)(ulong)uVar11;
    if (uVar11 == 0) {
      return;
    }
  }
  else {
    secp256k1_scalar_from_signed62_cold_6();
LAB_001459cc:
    secp256k1_scalar_from_signed62_cold_5();
LAB_001459d1:
    secp256k1_scalar_from_signed62_cold_4();
LAB_001459d6:
    secp256k1_scalar_from_signed62_cold_3();
LAB_001459db:
    secp256k1_scalar_from_signed62_cold_2();
  }
  secp256k1_scalar_from_signed62_cold_1();
  lVar17 = *(long *)r;
  lStack_58 = *(long *)((long)r + 8);
  lStack_60 = *(long *)((long)r + 0x10);
  lStack_68 = *(long *)((long)r + 0x18);
  lStack_78 = *(long *)((long)r + 0x20);
  lVar16 = a->v[0];
  piStack_40 = *(int64_t **)((long)a + 8);
  lVar15 = *(long *)((long)a + 0x10);
  uStack_a0 = *extraout_RDX;
  piStack_98 = (int64_t *)extraout_RDX[1];
  uStack_b0 = extraout_RDX[2];
  piStack_a8 = (int64_t *)extraout_RDX[3];
  lStack_48 = *(long *)((long)a + 0x18);
  lStack_80 = *(long *)((long)a + 0x20);
  uVar12 = 5;
  psVar13 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
  psStack_b8 = (secp256k1_modinv64_signed62 *)0x145a7b;
  a_00 = (int64_t *)r;
  uStack_38 = unaff_RBX;
  iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)r,5,in_RCX,-2);
  piVar21 = a->v;
  if (iVar4 < 1) {
LAB_00146520:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x146525;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_00146525:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x14652a;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_0014652a:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x14652f;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_0014652f:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x146534;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_00146534:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x146539;
    secp256k1_modinv64_update_de_62_cold_30();
    psVar34 = in_RCX;
LAB_00146539:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x14653e;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_0014653e:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x146543;
    secp256k1_modinv64_update_de_62_cold_1();
    in_RCX = psVar34;
LAB_00146543:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x146548;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_00146548:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x14654d;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_0014654d:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x146552;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_00146552:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x146557;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_00146557:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x14655c;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_0014655c:
    a_01 = a_00;
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x146561;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_00146561:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x146566;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_00146566:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x14656b;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_0014656b:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x146570;
    secp256k1_modinv64_update_de_62_cold_9();
    a_00 = a_01;
LAB_00146570:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x146575;
    secp256k1_modinv64_update_de_62_cold_28();
  }
  else {
    psVar13 = (secp256k1_modinv64_signed62 *)0x1;
    uVar12 = 5;
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x145a9d;
    a_00 = (int64_t *)r;
    piStack_70 = (int64_t *)r;
    iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)r,5,in_RCX,1);
    if (-1 < iVar4) goto LAB_00146525;
    uVar12 = 5;
    psVar13 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x145abc;
    a_00 = a->v;
    iVar4 = secp256k1_modinv64_mul_cmp_62(a,5,in_RCX,-2);
    if (iVar4 < 1) goto LAB_0014652a;
    psVar13 = (secp256k1_modinv64_signed62 *)0x1;
    uVar12 = 5;
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x145ad9;
    a_00 = a->v;
    iVar4 = secp256k1_modinv64_mul_cmp_62(a,5,in_RCX,1);
    if (-1 < iVar4) goto LAB_0014652f;
    piVar21 = (int64_t *)0x3fffffffffffffff;
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x145aff;
    piStack_88 = a->v;
    lStack_50 = lVar15;
    iVar7 = secp256k1_modinv64_abs(uStack_a0);
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x145b0c;
    a_00 = piStack_98;
    iVar8 = secp256k1_modinv64_abs((int64_t)piStack_98);
    psVar13 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar8);
    if ((long)psVar13 < iVar7) goto LAB_00146534;
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x145b27;
    iVar7 = secp256k1_modinv64_abs(uStack_b0);
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x145b34;
    a_00 = piStack_a8;
    iVar8 = secp256k1_modinv64_abs((int64_t)piStack_a8);
    psVar13 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar8);
    psVar34 = in_RCX;
    if ((long)psVar13 < iVar7) goto LAB_00146539;
    uVar12 = uStack_a0 * lVar17;
    psVar13 = SUB168(SEXT816((long)uStack_a0) * SEXT816(lVar17),8);
    uVar23 = (long)piStack_98 * lVar16;
    a_00 = SUB168(SEXT816((long)piStack_98) * SEXT816(lVar16),8);
    r = (secp256k1_scalar *)0x7fffffffffffffff;
    lVar15 = (0x7fffffffffffffff - (long)a_00) - (long)psVar13;
    if ((SBORROW8(0x7fffffffffffffff - (long)a_00,(long)psVar13) !=
        SBORROW8(lVar15,(ulong)(~uVar23 < uVar12))) !=
        (long)(lVar15 - (ulong)(~uVar23 < uVar12)) < 0 && -1 < (long)a_00) goto LAB_00146570;
    piVar25 = (int64_t *)(uVar23 + uVar12);
    a_00 = (int64_t *)((long)a_00 + (long)psVar13 + (ulong)CARRY8(uVar23,uVar12));
    uVar9 = uStack_b0 * lVar17;
    lVar15 = SUB168(SEXT816((long)uStack_b0) * SEXT816(lVar17),8);
    uVar6 = (long)piStack_a8 * lVar16;
    lVar16 = SUB168(SEXT816((long)piStack_a8) * SEXT816(lVar16),8);
    uVar23 = (ulong)(-uVar6 - 1 < uVar9);
    lVar17 = (0x7fffffffffffffff - lVar16) - lVar15;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar16,lVar15) != SBORROW8(lVar17,uVar23)) !=
             (long)(lVar17 - uVar23) < 0;
    psVar13 = (secp256k1_modinv64_signed62 *)CONCAT71((int7)(-uVar6 - 1 >> 8),bVar35 && -1 < lVar16)
    ;
    if (!bVar35 || -1 >= lVar16) {
      psVar34 = (secp256k1_modinv64_signed62 *)(lStack_78 >> 0x3f);
      psVar13 = (secp256k1_modinv64_signed62 *)(lStack_80 >> 0x3f);
      lVar24 = ((ulong)piStack_98 & (ulong)psVar13) + (uStack_a0 & (ulong)psVar34);
      piVar27 = (int64_t *)(uVar6 + uVar9);
      lVar16 = lVar16 + lVar15 + (ulong)CARRY8(uVar6,uVar9);
      lVar17 = in_RCX->v[0];
      uVar23 = in_RCX[1].v[0];
      uVar12 = lVar24 - (uVar23 * (long)piVar25 + lVar24 & 0x3fffffffffffffff);
      piVar10 = (int64_t *)(uVar12 * lVar17);
      a_01 = SUB168(SEXT816((long)uVar12) * SEXT816(lVar17),8);
      psStack_90 = in_RCX;
      if (-1 < (long)a_01) {
        uVar9 = (ulong)((undefined1 *)(-(long)piVar10 - 1U) < piVar25);
        lVar15 = (0x7fffffffffffffff - (long)a_01) - (long)a_00;
        if ((SBORROW8(0x7fffffffffffffff - (long)a_01,(long)a_00) != SBORROW8(lVar15,uVar9)) ==
            (long)(lVar15 - uVar9) < 0) goto LAB_00145c62;
LAB_00145e23:
        psStack_b8 = (secp256k1_modinv64_signed62 *)0x145e28;
        secp256k1_modinv64_update_de_62_cold_26();
LAB_00145e28:
        lVar24 = (-0x8000000000000000 - lVar17) - (ulong)(uVar23 != 0);
        lVar15 = lVar16 - lVar24;
        if ((SBORROW8(lVar16,lVar24) !=
            SBORROW8(lVar15,(ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-uVar23))) ==
            (long)(lVar15 - (ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-uVar23)) < 0)
        goto LAB_00145cb2;
LAB_00145e4a:
        psStack_b8 = (secp256k1_modinv64_signed62 *)0x145e4f;
        secp256k1_modinv64_update_de_62_cold_25();
        uVar9 = extraout_RAX;
        lVar16 = extraout_RDX_00;
LAB_00145e4f:
        psVar34 = (secp256k1_modinv64_signed62 *)
                  ((-0x8000000000000000 - lVar16) - (ulong)(uVar9 != 0));
        a_00 = (int64_t *)
               (((long)piVar25 - (long)psVar34) -
               (ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-uVar9));
        if ((SBORROW8((long)piVar25,(long)psVar34) !=
            SBORROW8((long)piVar25 - (long)psVar34,
                     (ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-uVar9))) == (long)a_00 < 0) {
LAB_00145d35:
          uVar23 = uVar23 >> 0x3e | lVar17 << 2;
          bVar35 = CARRY8((ulong)piVar27,uVar9);
          piVar27 = (int64_t *)((long)piVar27 + uVar9);
          piVar25 = (int64_t *)((long)piVar25 + (ulong)bVar35 + lVar16);
          psVar34 = (secp256k1_modinv64_signed62 *)(uStack_b0 * lStack_58 + uVar23);
          a_00 = (int64_t *)
                 (SUB168(SEXT816((long)uStack_b0) * SEXT816(lStack_58),8) + (lVar17 >> 0x3e) +
                 (ulong)CARRY8(uStack_b0 * lStack_58,uVar23));
          uVar23 = (long)piStack_a8 * (long)a_01;
          lVar17 = SUB168(SEXT816((long)piStack_a8) * SEXT816((long)a_01),8);
          if (lVar17 < 0) goto LAB_00145e79;
          uVar9 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar23) < psVar34);
          lVar16 = (0x7fffffffffffffff - lVar17) - (long)a_00;
          in_RCX = (secp256k1_modinv64_signed62 *)(lVar16 - uVar9);
          if ((SBORROW8(0x7fffffffffffffff - lVar17,(long)a_00) != SBORROW8(lVar16,uVar9)) !=
              (long)in_RCX < 0) goto LAB_00145e91;
        }
        else {
LAB_00145e74:
          psStack_b8 = (secp256k1_modinv64_signed62 *)0x145e79;
          secp256k1_modinv64_update_de_62_cold_24();
          uVar23 = extraout_RAX_00;
          lVar17 = extraout_RDX_01;
LAB_00145e79:
          in_RCX = (secp256k1_modinv64_signed62 *)
                   ((-0x8000000000000000 - lVar17) - (ulong)(uVar23 != 0));
          if ((SBORROW8((long)a_00,(long)in_RCX) !=
              SBORROW8((long)a_00 - (long)in_RCX,
                       (ulong)(psVar34 < (secp256k1_modinv64_signed62 *)-uVar23))) !=
              (long)(((long)a_00 - (long)in_RCX) -
                    (ulong)(psVar34 < (secp256k1_modinv64_signed62 *)-uVar23)) < 0) {
LAB_00145e91:
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x145e96;
            secp256k1_modinv64_update_de_62_cold_23();
            goto LAB_00145e9c;
          }
        }
        bVar35 = CARRY8((ulong)psVar34,uVar23);
        psVar34 = (secp256k1_modinv64_signed62 *)((long)psVar34->v + uVar23);
        a_00 = (int64_t *)((long)a_00 + (ulong)bVar35 + lVar17);
        psVar29 = (secp256k1_modinv64_signed62 *)psStack_90->v[1];
        in_RCX = psStack_90;
        if (psVar29 == (secp256k1_modinv64_signed62 *)0x0) goto LAB_00145e9c;
        piVar10 = (int64_t *)((long)psVar29 * uVar12);
        piVar18 = SUB168(SEXT816((long)psVar29) * SEXT816((long)uVar12),8);
        if ((long)piVar18 < 0) goto LAB_00146436;
        uVar23 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)piVar10 - 1U) < piVar27);
        lVar17 = (0x7fffffffffffffff - (long)piVar18) - (long)piVar25;
        if ((SBORROW8(0x7fffffffffffffff - (long)piVar18,(long)piVar25) != SBORROW8(lVar17,uVar23))
            != (long)(lVar17 - uVar23) < 0) goto LAB_00146458;
LAB_00145dcf:
        bVar35 = CARRY8((ulong)piVar10,(ulong)piVar27);
        piVar10 = (int64_t *)((long)piVar10 + (long)piVar27);
        piVar18 = (int64_t *)((long)piVar18 + (long)piVar25 + (ulong)bVar35);
        uVar23 = (long)psVar29 * (long)psVar13;
        lVar17 = SUB168(SEXT816((long)psVar29) * SEXT816((long)psVar13),8);
        if (lVar17 < 0) goto LAB_0014645d;
        psVar26 = (secp256k1_modinv64_signed62 *)(-1 - uVar23);
        lVar16 = ((long)r - lVar17) - (long)a_00;
        puVar28 = (undefined1 *)(lVar16 - (ulong)(psVar26 < psVar34));
        if ((SBORROW8((long)r - lVar17,(long)a_00) != SBORROW8(lVar16,(ulong)(psVar26 < psVar34)))
            != (long)puVar28 < 0) goto LAB_0014647f;
LAB_00145e00:
        bVar35 = CARRY8((ulong)psVar34,uVar23);
        psVar34 = (secp256k1_modinv64_signed62 *)((long)psVar34->v + uVar23);
        a_00 = (int64_t *)((long)a_00 + (ulong)bVar35 + lVar17);
        piVar25 = piVar18;
        piVar27 = piVar10;
LAB_00145e9c:
        piVar18 = piStack_70;
        uVar23 = (long)piVar25 << 2 | (ulong)piVar27 >> 0x3e;
        a_01 = (int64_t *)(uStack_a0 * lStack_60 + uVar23);
        psVar29 = (secp256k1_modinv64_signed62 *)
                  (SUB168(SEXT816((long)uStack_a0) * SEXT816(lStack_60),8) + ((long)piVar25 >> 0x3e)
                  + (ulong)CARRY8(uStack_a0 * lStack_60,uVar23));
        *piStack_70 = (ulong)piVar27 & 0x3fffffffffffffff;
        uVar23 = (long)piStack_98 * lStack_50;
        lVar17 = SUB168(SEXT816((long)piStack_98) * SEXT816(lStack_50),8);
        *piStack_88 = (ulong)psVar34 & 0x3fffffffffffffff;
        if (lVar17 < 0) {
          puVar28 = (undefined1 *)((-0x8000000000000000 - lVar17) - (ulong)(uVar23 != 0));
          psVar26 = (secp256k1_modinv64_signed62 *)
                    (((long)psVar29 - (long)puVar28) -
                    (ulong)(a_01 < (secp256k1_modinv64_signed62 *)-uVar23));
          if ((SBORROW8((long)psVar29,(long)puVar28) !=
              SBORROW8((long)psVar29 - (long)puVar28,
                       (ulong)(a_01 < (secp256k1_modinv64_signed62 *)-uVar23))) != (long)psVar26 < 0
             ) goto LAB_00145ffa;
LAB_00145f0a:
          uVar9 = (ulong)psVar34 >> 0x3e | (long)a_00 << 2;
          bVar35 = CARRY8((ulong)a_01,uVar23);
          a_01 = (int64_t *)((long)a_01 + uVar23);
          psVar29 = (secp256k1_modinv64_signed62 *)((long)psVar29->v + (ulong)bVar35 + lVar17);
          puVar28 = (undefined1 *)(uStack_b0 * lStack_60 + uVar9);
          psVar26 = (secp256k1_modinv64_signed62 *)
                    (SUB168(SEXT816((long)uStack_b0) * SEXT816(lStack_60),8) + ((long)a_00 >> 0x3e)
                    + (ulong)CARRY8(uStack_b0 * lStack_60,uVar9));
          uVar23 = (long)piStack_a8 * lStack_50;
          lVar17 = SUB168(SEXT816((long)piStack_a8) * SEXT816(lStack_50),8);
          if (lVar17 < 0) goto LAB_00145fff;
          uVar9 = (ulong)((undefined1 *)(-1 - uVar23) < puVar28);
          lVar16 = ((long)r - lVar17) - (long)psVar26;
          if ((SBORROW8((long)r - lVar17,(long)psVar26) != SBORROW8(lVar16,uVar9)) !=
              (long)(lVar16 - uVar9) < 0) goto LAB_00146021;
        }
        else {
          psVar26 = (secp256k1_modinv64_signed62 *)(-1 - uVar23);
          lVar16 = ((long)r - lVar17) - (long)psVar29;
          puVar28 = (undefined1 *)(lVar16 - (ulong)(psVar26 < a_01));
          if ((SBORROW8((long)r - lVar17,(long)psVar29) != SBORROW8(lVar16,(ulong)(psVar26 < a_01)))
              == (long)puVar28 < 0) goto LAB_00145f0a;
LAB_00145ffa:
          psStack_b8 = (secp256k1_modinv64_signed62 *)0x145fff;
          secp256k1_modinv64_update_de_62_cold_22();
          uVar23 = extraout_RAX_01;
          lVar17 = extraout_RDX_02;
LAB_00145fff:
          lVar15 = (-0x8000000000000000 - lVar17) - (ulong)(uVar23 != 0);
          lVar16 = (long)psVar26 - lVar15;
          if ((SBORROW8((long)psVar26,lVar15) !=
              SBORROW8(lVar16,(ulong)(puVar28 < (undefined1 *)-uVar23))) !=
              (long)(lVar16 - (ulong)(puVar28 < (undefined1 *)-uVar23)) < 0) {
LAB_00146021:
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x146026;
            secp256k1_modinv64_update_de_62_cold_21();
            goto LAB_0014602c;
          }
        }
        bVar35 = CARRY8((ulong)puVar28,uVar23);
        puVar28 = puVar28 + uVar23;
        psVar26 = (secp256k1_modinv64_signed62 *)((long)psVar26->v + (ulong)bVar35 + lVar17);
        piVar10 = (int64_t *)in_RCX->v[2];
        if (piVar10 == (int64_t *)0x0) goto LAB_0014602c;
        a_00 = (int64_t *)((long)piVar10 * uVar12);
        psVar34 = SUB168(SEXT816((long)piVar10) * SEXT816((long)uVar12),8);
        if ((long)psVar34 < 0) goto LAB_00146484;
        uVar23 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)a_00 - 1U) < a_01);
        lVar17 = ((long)r - (long)psVar34) - (long)psVar29;
        piVar25 = a_01;
        if ((SBORROW8((long)r - (long)psVar34,(long)psVar29) != SBORROW8(lVar17,uVar23)) !=
            (long)(lVar17 - uVar23) < 0) goto LAB_001464a6;
LAB_00145f9f:
        bVar35 = CARRY8((ulong)a_00,(ulong)piVar25);
        a_00 = (int64_t *)((long)a_00 + (long)piVar25);
        psVar34 = (secp256k1_modinv64_signed62 *)
                  ((long)psVar29->v + (ulong)bVar35 + (long)psVar34->v);
        uVar23 = (long)piVar10 * (long)psVar13;
        lVar17 = SUB168(SEXT816((long)piVar10) * SEXT816((long)psVar13),8);
        if (lVar17 < 0) goto LAB_001464ab;
        piVar30 = (int64_t *)(-1 - uVar23);
        lVar16 = ((long)r - lVar17) - (long)psVar26;
        in_RCX = (secp256k1_modinv64_signed62 *)(lVar16 - (ulong)(piVar30 < puVar28));
        a_01 = a_00;
        psVar29 = psVar34;
        if ((SBORROW8((long)r - lVar17,(long)psVar26) != SBORROW8(lVar16,(ulong)(piVar30 < puVar28))
            ) != (long)in_RCX < 0) goto LAB_001464cd;
LAB_00145fd0:
        bVar35 = CARRY8((ulong)puVar28,uVar23);
        puVar28 = puVar28 + uVar23;
        psVar26 = (secp256k1_modinv64_signed62 *)((long)psVar26->v + (ulong)bVar35 + lVar17);
LAB_0014602c:
        uVar23 = (long)psVar29 << 2 | (ulong)a_01 >> 0x3e;
        piVar25 = (int64_t *)(uStack_a0 * lStack_68 + uVar23);
        piVar30 = (int64_t *)
                  (SUB168(SEXT816((long)uStack_a0) * SEXT816(lStack_68),8) + ((long)psVar29 >> 0x3e)
                  + (ulong)CARRY8(uStack_a0 * lStack_68,uVar23));
        piVar18[1] = (ulong)a_01 & 0x3fffffffffffffff;
        uVar23 = (long)piStack_98 * lStack_48;
        lVar17 = SUB168(SEXT816((long)piStack_98) * SEXT816(lStack_48),8);
        piStack_88[1] = (ulong)puVar28 & 0x3fffffffffffffff;
        if (lVar17 < 0) {
          uVar9 = (-0x8000000000000000 - lVar17) - (ulong)(uVar23 != 0);
          a_00 = (int64_t *)
                 (((long)piVar30 - uVar9) -
                 (ulong)(piVar25 < (secp256k1_modinv64_signed62 *)-uVar23));
          if ((SBORROW8((long)piVar30,uVar9) !=
              SBORROW8((long)piVar30 - uVar9,
                       (ulong)(piVar25 < (secp256k1_modinv64_signed62 *)-uVar23))) != (long)a_00 < 0
             ) goto LAB_00146102;
LAB_00146098:
          uVar6 = (ulong)puVar28 >> 0x3e | (long)psVar26 << 2;
          bVar35 = CARRY8((ulong)piVar25,uVar23);
          piVar25 = (int64_t *)((long)piVar25 + uVar23);
          piVar30 = (int64_t *)((long)piVar30 + (ulong)bVar35 + lVar17);
          uVar9 = uStack_b0 * lStack_68 + uVar6;
          a_00 = (int64_t *)
                 (SUB168(SEXT816((long)uStack_b0) * SEXT816(lStack_68),8) + ((long)psVar26 >> 0x3e)
                 + (ulong)CARRY8(uStack_b0 * lStack_68,uVar6));
          uVar23 = (long)piStack_a8 * lStack_48;
          lVar17 = SUB168(SEXT816((long)piStack_a8) * SEXT816(lStack_48),8);
          if (lVar17 < 0) goto LAB_00146107;
          uVar6 = (ulong)(-uVar23 - 1 < uVar9);
          lVar16 = ((long)r - lVar17) - (long)a_00;
          bVar35 = SBORROW8((long)r - lVar17,(long)a_00) != SBORROW8(lVar16,uVar6);
          lVar16 = lVar16 - uVar6;
        }
        else {
          a_00 = (int64_t *)(-1 - uVar23);
          lVar16 = ((long)r - lVar17) - (long)piVar30;
          uVar9 = lVar16 - (ulong)(a_00 < piVar25);
          if ((SBORROW8((long)r - lVar17,(long)piVar30) != SBORROW8(lVar16,(ulong)(a_00 < piVar25)))
              == (long)uVar9 < 0) goto LAB_00146098;
LAB_00146102:
          psStack_b8 = (secp256k1_modinv64_signed62 *)0x146107;
          secp256k1_modinv64_update_de_62_cold_20();
          uVar23 = extraout_RAX_02;
          lVar17 = extraout_RDX_03;
LAB_00146107:
          lVar15 = (-0x8000000000000000 - lVar17) - (ulong)(uVar23 != 0);
          lVar16 = (long)a_00 - lVar15;
          bVar35 = SBORROW8((long)a_00,lVar15) != SBORROW8(lVar16,(ulong)(uVar9 < -uVar23));
          lVar16 = lVar16 - (ulong)(uVar9 < -uVar23);
        }
        in_RCX = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        if (bVar35 != lVar16 < 0) goto LAB_00146548;
        psVar34 = (secp256k1_modinv64_signed62 *)(uVar9 + uVar23);
        a_00 = (int64_t *)((long)a_00 + (ulong)CARRY8(uVar9,uVar23) + lVar17);
        psVar26 = (secp256k1_modinv64_signed62 *)psStack_90->v[3];
        if (psVar26 == (secp256k1_modinv64_signed62 *)0x0) goto LAB_001461a6;
        piVar10 = (int64_t *)((long)psVar26 * uVar12);
        piVar18 = SUB168(SEXT816((long)psVar26) * SEXT816((long)uVar12),8);
        if ((long)piVar18 < 0) goto LAB_001464d2;
        uVar23 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)piVar10 - 1U) < piVar25);
        lVar17 = ((long)r - (long)piVar18) - (long)piVar30;
        if ((SBORROW8((long)r - (long)piVar18,(long)piVar30) != SBORROW8(lVar17,uVar23)) !=
            (long)(lVar17 - uVar23) < 0) goto LAB_001464f4;
LAB_00146167:
        bVar35 = CARRY8((ulong)piVar10,(ulong)piVar25);
        piVar10 = (int64_t *)((long)piVar10 + (long)piVar25);
        piVar18 = (int64_t *)((long)piVar18 + (long)piVar30 + (ulong)bVar35);
        uVar23 = (long)psVar26 * (long)psVar13;
        lVar17 = SUB168(SEXT816((long)psVar26) * SEXT816((long)psVar13),8);
        if (lVar17 < 0) goto LAB_001464f9;
        uVar9 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar23) < psVar34);
        lVar16 = ((long)r - lVar17) - (long)a_00;
        piVar30 = piVar18;
        piVar25 = piVar10;
        if ((SBORROW8((long)r - lVar17,(long)a_00) != SBORROW8(lVar16,uVar9)) ==
            (long)(lVar16 - uVar9) < 0) {
          do {
            bVar35 = CARRY8((ulong)psVar34,uVar23);
            psVar34 = (secp256k1_modinv64_signed62 *)((long)psVar34->v + uVar23);
            a_00 = (int64_t *)((long)a_00 + (ulong)bVar35 + lVar17);
LAB_001461a6:
            a_01 = piStack_70;
            uVar23 = (long)piVar30 << 2 | (ulong)piVar25 >> 0x3e;
            psVar29 = (secp256k1_modinv64_signed62 *)((ulong)piVar25 & 0x3fffffffffffffff);
            piVar27 = (int64_t *)(uStack_a0 * lStack_78 + uVar23);
            piVar25 = (int64_t *)
                      (SUB168(SEXT816((long)uStack_a0) * SEXT816(lStack_78),8) +
                       ((long)piVar30 >> 0x3e) + (ulong)CARRY8(uStack_a0 * lStack_78,uVar23));
            piStack_70[2] = (int64_t)psVar29;
            uVar23 = (long)piStack_98 * lStack_80;
            lVar17 = SUB168(SEXT816((long)piStack_98) * SEXT816(lStack_80),8);
            piStack_88[2] = (ulong)psVar34 & 0x3fffffffffffffff;
            if (lVar17 < 0) {
              lVar15 = (-0x8000000000000000 - lVar17) - (ulong)(uVar23 != 0);
              lVar16 = (long)piVar25 - lVar15;
              psVar26 = (secp256k1_modinv64_signed62 *)
                        (lVar16 - (ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-uVar23));
              if ((SBORROW8((long)piVar25,lVar15) !=
                  SBORROW8(lVar16,(ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-uVar23))) !=
                  (long)psVar26 < 0) goto LAB_00146280;
LAB_00146214:
              uVar9 = (ulong)psVar34 >> 0x3e | (long)a_00 << 2;
              bVar35 = CARRY8((ulong)piVar27,uVar23);
              piVar27 = (int64_t *)((long)piVar27 + uVar23);
              piVar25 = (int64_t *)((long)piVar25 + (ulong)bVar35 + lVar17);
              psVar29 = (secp256k1_modinv64_signed62 *)(uStack_b0 * lStack_78 + uVar9);
              psVar26 = (secp256k1_modinv64_signed62 *)
                        (SUB168(SEXT816((long)uStack_b0) * SEXT816(lStack_78),8) +
                         ((long)a_00 >> 0x3e) + (ulong)CARRY8(uStack_b0 * lStack_78,uVar9));
              uVar23 = (long)piStack_a8 * lStack_80;
              lVar17 = SUB168(SEXT816((long)piStack_a8) * SEXT816(lStack_80),8);
              if (lVar17 < 0) goto LAB_00146285;
              a_00 = (int64_t *)(-1 - uVar23);
              lVar16 = ((long)r - lVar17) - (long)psVar26;
              bVar35 = SBORROW8((long)r - lVar17,(long)psVar26) !=
                       SBORROW8(lVar16,(ulong)(a_00 < psVar29));
              piVar10 = (int64_t *)(lVar16 - (ulong)(a_00 < psVar29));
            }
            else {
              psVar26 = (secp256k1_modinv64_signed62 *)(-1 - uVar23);
              lVar16 = ((long)r - lVar17) - (long)piVar25;
              if ((SBORROW8((long)r - lVar17,(long)piVar25) !=
                  SBORROW8(lVar16,(ulong)(psVar26 < piVar27))) ==
                  (long)(lVar16 - (ulong)(psVar26 < piVar27)) < 0) goto LAB_00146214;
LAB_00146280:
              psStack_b8 = (secp256k1_modinv64_signed62 *)0x146285;
              secp256k1_modinv64_update_de_62_cold_18();
              uVar23 = extraout_RAX_03;
              lVar17 = extraout_RDX_04;
LAB_00146285:
              lVar15 = (-0x8000000000000000 - lVar17) - (ulong)(uVar23 != 0);
              lVar16 = (long)psVar26 - lVar15;
              bVar35 = SBORROW8((long)psVar26,lVar15) !=
                       SBORROW8(lVar16,(ulong)(psVar29 < (secp256k1_modinv64_signed62 *)-uVar23));
              a_00 = (int64_t *)(lVar16 - (ulong)(psVar29 < (secp256k1_modinv64_signed62 *)-uVar23))
              ;
              piVar10 = a_00;
            }
            in_RCX = psStack_90;
            piVar18 = (int64_t *)0x8000000000000000;
            if (bVar35 != (long)piVar10 < 0) goto LAB_0014654d;
            piVar10 = (int64_t *)((long)psVar29->v + uVar23);
            psVar29 = (secp256k1_modinv64_signed62 *)
                      ((long)psVar26->v + (ulong)CARRY8((ulong)psVar29,uVar23) + lVar17);
            psVar34 = (secp256k1_modinv64_signed62 *)psStack_90->v[4];
            a_00 = (int64_t *)((long)psVar34 * uVar12);
            uVar12 = SUB168(SEXT816((long)psVar34) * SEXT816((long)uVar12),8);
            if ((long)uVar12 < 0) {
              lVar16 = (-0x8000000000000000 - uVar12) - (ulong)(a_00 != (int64_t *)0x0);
              lVar17 = (long)piVar25 - lVar16;
              if ((SBORROW8((long)piVar25,lVar16) !=
                  SBORROW8(lVar17,(ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-(long)a_00))) !=
                  (long)(lVar17 - (ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-(long)a_00)) < 0
                 ) goto LAB_00146411;
LAB_001462e0:
              bVar35 = CARRY8((ulong)a_00,(ulong)piVar27);
              a_00 = (int64_t *)((long)a_00 + (long)piVar27);
              uVar12 = (long)piVar25 + bVar35 + uVar12;
              uVar23 = (long)psVar34 * (long)psVar13;
              lVar17 = SUB168(SEXT816((long)psVar34) * SEXT816((long)psVar13),8);
              if (lVar17 < 0) goto LAB_00146416;
              psVar13 = (secp256k1_modinv64_signed62 *)(-uVar23 - 1);
              lVar16 = (long)r - lVar17;
              lVar15 = lVar16 - (long)psVar29;
              r = (secp256k1_scalar *)(lVar15 - (ulong)(psVar13 < piVar10));
              if ((SBORROW8(lVar16,(long)psVar29) != SBORROW8(lVar15,(ulong)(psVar13 < piVar10))) ==
                  (long)r < 0) goto LAB_0014630e;
            }
            else {
              uVar23 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)a_00 - 1U) < piVar27);
              lVar17 = ((long)r - uVar12) - (long)piVar25;
              if ((SBORROW8((long)r - uVar12,(long)piVar25) != SBORROW8(lVar17,uVar23)) ==
                  (long)(lVar17 - uVar23) < 0) goto LAB_001462e0;
LAB_00146411:
              psStack_b8 = (secp256k1_modinv64_signed62 *)0x146416;
              secp256k1_modinv64_update_de_62_cold_16();
              uVar23 = extraout_RAX_04;
              lVar17 = extraout_RDX_05;
LAB_00146416:
              piVar25 = (int64_t *)((-0x8000000000000000 - lVar17) - (ulong)(uVar23 != 0));
              psVar13 = (secp256k1_modinv64_signed62 *)
                        (((long)psVar29 - (long)piVar25) -
                        (ulong)(piVar10 < (secp256k1_modinv64_signed62 *)-uVar23));
              if ((SBORROW8((long)psVar29,(long)piVar25) !=
                  SBORROW8((long)psVar29 - (long)piVar25,
                           (ulong)(piVar10 < (secp256k1_modinv64_signed62 *)-uVar23))) ==
                  (long)psVar13 < 0) {
LAB_0014630e:
                r = (secp256k1_scalar *)piStack_88;
                lVar17 = (long)psVar29->v + (ulong)CARRY8(uVar23,(ulong)piVar10) + lVar17;
                psVar13 = (secp256k1_modinv64_signed62 *)(uVar12 << 2 | (ulong)a_00 >> 0x3e);
                a_01[3] = (ulong)a_00 & 0x3fffffffffffffff;
                piVar21 = (int64_t *)(uVar23 + (long)piVar10 & 0x3fffffffffffffff);
                piStack_88[3] = (int64_t)piVar21;
                a_00 = psVar13[0x333333333333332].v + 4;
                uVar12 = ((long)uVar12 >> 0x3e) + -1 +
                         (ulong)((secp256k1_modinv64_signed62 *)0x7fffffffffffffff < psVar13);
                if (uVar12 != 0xffffffffffffffff) goto LAB_00146552;
                uVar12 = 0xffffffffffffffff;
                uVar23 = uVar23 + (long)piVar10 >> 0x3e | lVar17 * 4;
                a_01[4] = (int64_t)psVar13;
                if ((lVar17 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar23) != -1)
                goto LAB_00146557;
                piStack_88[4] = uVar23;
                uVar12 = 5;
                psVar13 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
                psStack_b8 = (secp256k1_modinv64_signed62 *)0x146386;
                a_00 = a_01;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,in_RCX,-2);
                if (iVar4 < 1) goto LAB_0014655c;
                psVar13 = (secp256k1_modinv64_signed62 *)0x1;
                uVar12 = 5;
                psStack_b8 = (secp256k1_modinv64_signed62 *)0x1463a3;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,in_RCX,1);
                if (-1 < iVar4) goto LAB_00146561;
                uVar12 = 5;
                psVar13 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
                psStack_b8 = (secp256k1_modinv64_signed62 *)0x1463c2;
                a_01 = (int64_t *)r;
                iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)r,5,in_RCX,-2);
                if (iVar4 < 1) goto LAB_00146566;
                psVar13 = (secp256k1_modinv64_signed62 *)0x1;
                uVar12 = 5;
                psStack_b8 = (secp256k1_modinv64_signed62 *)0x1463df;
                a_01 = (int64_t *)r;
                iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)r,5,in_RCX,1);
                if (iVar4 < 0) {
                  return;
                }
                goto LAB_0014656b;
              }
            }
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x146436;
            secp256k1_modinv64_update_de_62_cold_15();
LAB_00146436:
            lVar16 = (-0x8000000000000000 - (long)piVar18) - (ulong)(piVar10 != (int64_t *)0x0);
            lVar17 = (long)piVar25 - lVar16;
            if ((SBORROW8((long)piVar25,lVar16) !=
                SBORROW8(lVar17,(ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-(long)piVar10)))
                == (long)(lVar17 - (ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-(long)piVar10))
                   < 0) goto LAB_00145dcf;
LAB_00146458:
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x14645d;
            secp256k1_modinv64_update_de_62_cold_4();
            uVar23 = extraout_RAX_05;
            lVar17 = extraout_RDX_06;
LAB_0014645d:
            puVar28 = (undefined1 *)((-0x8000000000000000 - lVar17) - (ulong)(uVar23 != 0));
            psVar26 = (secp256k1_modinv64_signed62 *)
                      (((long)a_00 - (long)puVar28) -
                      (ulong)(psVar34 < (secp256k1_modinv64_signed62 *)-uVar23));
            if ((SBORROW8((long)a_00,(long)puVar28) !=
                SBORROW8((long)a_00 - (long)puVar28,
                         (ulong)(psVar34 < (secp256k1_modinv64_signed62 *)-uVar23))) ==
                (long)psVar26 < 0) goto LAB_00145e00;
LAB_0014647f:
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x146484;
            secp256k1_modinv64_update_de_62_cold_3();
LAB_00146484:
            lVar16 = (-0x8000000000000000 - (long)psVar34) - (ulong)(a_00 != (int64_t *)0x0);
            lVar17 = (long)psVar29 - lVar16;
            piVar25 = a_01;
            if ((SBORROW8((long)psVar29,lVar16) !=
                SBORROW8(lVar17,(ulong)(a_01 < (secp256k1_modinv64_signed62 *)-(long)a_00))) ==
                (long)(lVar17 - (ulong)(a_01 < (secp256k1_modinv64_signed62 *)-(long)a_00)) < 0)
            goto LAB_00145f9f;
LAB_001464a6:
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x1464ab;
            secp256k1_modinv64_update_de_62_cold_6();
            uVar23 = extraout_RAX_06;
            lVar17 = extraout_RDX_07;
            piVar25 = a_01;
LAB_001464ab:
            in_RCX = (secp256k1_modinv64_signed62 *)
                     ((-0x8000000000000000 - lVar17) - (ulong)(uVar23 != 0));
            piVar30 = (int64_t *)
                      (((long)psVar26 - (long)in_RCX) - (ulong)(puVar28 < (undefined1 *)-uVar23));
            a_01 = a_00;
            psVar29 = psVar34;
            if ((SBORROW8((long)psVar26,(long)in_RCX) !=
                SBORROW8((long)psVar26 - (long)in_RCX,(ulong)(puVar28 < (undefined1 *)-uVar23))) ==
                (long)piVar30 < 0) goto LAB_00145fd0;
LAB_001464cd:
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x1464d2;
            secp256k1_modinv64_update_de_62_cold_5();
LAB_001464d2:
            lVar16 = (-0x8000000000000000 - (long)piVar18) - (ulong)(piVar10 != (int64_t *)0x0);
            lVar17 = (long)piVar30 - lVar16;
            if ((SBORROW8((long)piVar30,lVar16) !=
                SBORROW8(lVar17,(ulong)(piVar25 < (secp256k1_modinv64_signed62 *)-(long)piVar10)))
                == (long)(lVar17 - (ulong)(piVar25 < (secp256k1_modinv64_signed62 *)-(long)piVar10))
                   < 0) goto LAB_00146167;
LAB_001464f4:
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x1464f9;
            secp256k1_modinv64_update_de_62_cold_8();
            uVar23 = extraout_RAX_07;
            lVar17 = extraout_RDX_08;
LAB_001464f9:
            lVar15 = (-0x8000000000000000 - lVar17) - (ulong)(uVar23 != 0);
            lVar16 = (long)a_00 - lVar15;
            piVar30 = piVar18;
            piVar25 = piVar10;
            if ((SBORROW8((long)a_00,lVar15) !=
                SBORROW8(lVar16,(ulong)(psVar34 < (secp256k1_modinv64_signed62 *)-uVar23))) !=
                (long)(lVar16 - (ulong)(psVar34 < (secp256k1_modinv64_signed62 *)-uVar23)) < 0)
            break;
          } while( true );
        }
        psStack_b8 = (secp256k1_modinv64_signed62 *)0x146520;
        secp256k1_modinv64_update_de_62_cold_7();
        goto LAB_00146520;
      }
      lVar24 = (-0x8000000000000000 - (long)a_01) - (ulong)(piVar10 != (int64_t *)0x0);
      lVar15 = (long)a_00 - lVar24;
      if ((SBORROW8((long)a_00,lVar24) !=
          SBORROW8(lVar15,(ulong)(piVar25 < (undefined1 *)-(long)piVar10))) !=
          (long)(lVar15 - (ulong)(piVar25 < (undefined1 *)-(long)piVar10)) < 0) goto LAB_00145e23;
LAB_00145c62:
      psVar34 = (secp256k1_modinv64_signed62 *)((ulong)psVar34 & uStack_b0);
      psVar13 = (secp256k1_modinv64_signed62 *)
                ((long)psVar34 +
                (((ulong)psVar13 & (ulong)piStack_a8) -
                ((long)psVar34->v + uVar23 * (long)piVar27 + ((ulong)psVar13 & (ulong)piStack_a8) &
                0x3fffffffffffffff)));
      bVar35 = CARRY8((ulong)piVar10,(ulong)piVar25);
      piVar10 = (int64_t *)((long)piVar10 + (long)piVar25);
      a_01 = (int64_t *)((long)a_01 + (long)a_00 + (ulong)bVar35);
      uVar23 = (long)psVar13 * lVar17;
      lVar17 = SUB168(SEXT816((long)psVar13) * SEXT816(lVar17),8);
      if (lVar17 < 0) goto LAB_00145e28;
      uVar9 = (ulong)((secp256k1_modinv64_signed62 *)(-uVar23 - 1) < piVar27);
      lVar15 = (0x7fffffffffffffff - lVar17) - lVar16;
      if ((SBORROW8(0x7fffffffffffffff - lVar17,lVar16) != SBORROW8(lVar15,uVar9)) !=
          (long)(lVar15 - uVar9) < 0) goto LAB_00145e4a;
LAB_00145cb2:
      bVar35 = CARRY8(uVar23,(ulong)piVar27);
      uVar23 = uVar23 + (long)piVar27;
      lVar17 = lVar17 + lVar16 + (ulong)bVar35;
      if (((ulong)piVar10 & 0x3fffffffffffffff) != 0) goto LAB_0014653e;
      in_RCX = psVar34;
      if ((uVar23 & 0x3fffffffffffffff) == 0) {
        uVar9 = (ulong)piVar10 >> 0x3e | (long)a_01 << 2;
        piVar27 = (int64_t *)(uStack_a0 * lStack_58 + uVar9);
        piVar25 = (int64_t *)
                  (SUB168(SEXT816((long)uStack_a0) * SEXT816(lStack_58),8) + ((long)a_01 >> 0x3e) +
                  (ulong)CARRY8(uStack_a0 * lStack_58,uVar9));
        uVar9 = (long)piStack_98 * (long)piStack_40;
        lVar16 = SUB168(SEXT816((long)piStack_98) * SEXT816((long)piStack_40),8);
        a_01 = piStack_40;
        if (lVar16 < 0) goto LAB_00145e4f;
        a_00 = (int64_t *)(-1 - uVar9);
        lVar15 = (0x7fffffffffffffff - lVar16) - (long)piVar25;
        psVar34 = (secp256k1_modinv64_signed62 *)(lVar15 - (ulong)(a_00 < piVar27));
        if ((SBORROW8(0x7fffffffffffffff - lVar16,(long)piVar25) !=
            SBORROW8(lVar15,(ulong)(a_00 < piVar27))) != (long)psVar34 < 0) goto LAB_00145e74;
        goto LAB_00145d35;
      }
      goto LAB_00146543;
    }
  }
  iVar4 = (int)uVar12;
  psStack_b8 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_27();
  psVar29 = &sStack_118;
  piStack_c8 = piVar21;
  piStack_c0 = (int64_t *)r;
  psStack_b8 = in_RCX;
  secp256k1_modinv64_mul_62(&sStack_f0,(secp256k1_modinv64_signed62 *)a_00,iVar4,1);
  psVar34 = a_02;
  secp256k1_modinv64_mul_62(&sStack_118,a_02,5,(int64_t)psVar13);
  lVar17 = 0;
  while ((ulong)sStack_f0.v[lVar17] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_118.v[lVar17]) goto LAB_0014660a;
    lVar17 = lVar17 + 1;
    if (lVar17 == 4) {
      uVar5 = 4;
      while( true ) {
        if (sStack_f0.v[uVar5] < sStack_118.v[uVar5]) {
          return;
        }
        if (sStack_118.v[uVar5] < sStack_f0.v[uVar5]) break;
        bVar35 = uVar5 == 0;
        uVar5 = uVar5 - 1;
        if (bVar35) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0014660a:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar4 = (int)psVar29;
  if (iVar4 < 1) {
LAB_001468b7:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_001468bc:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_001468c1:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_001468c6:
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_001468cb:
    secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_001468d0:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    lVar17 = psVar13->v[0];
    lVar16 = psVar13->v[1];
    lVar15 = psVar34->v[0];
    lVar24 = *extraout_RDX_09;
    uVar12 = lVar15 * lVar17;
    lVar19 = SUB168(SEXT816(lVar15) * SEXT816(lVar17),8);
    uVar23 = lVar24 * lVar16;
    lVar20 = SUB168(SEXT816(lVar24) * SEXT816(lVar16),8);
    lVar2 = (0x7fffffffffffffff - lVar20) - lVar19;
    if ((SBORROW8(0x7fffffffffffffff - lVar20,lVar19) != SBORROW8(lVar2,(ulong)(~uVar23 < uVar12)))
        != (long)(lVar2 - (ulong)(~uVar23 < uVar12)) < 0 && -1 < lVar20) goto LAB_001468d0;
    lVar2 = psVar13->v[2];
    lVar1 = psVar13->v[3];
    lVar20 = lVar20 + lVar19 + (ulong)CARRY8(uVar23,uVar12);
    uVar6 = lVar15 * lVar2;
    lVar19 = SUB168(SEXT816(lVar15) * SEXT816(lVar2),8);
    uVar14 = lVar24 * lVar1;
    lVar24 = SUB168(SEXT816(lVar24) * SEXT816(lVar1),8);
    uVar9 = (ulong)(-uVar14 - 1 < uVar6);
    lVar15 = (0x7fffffffffffffff - lVar24) - lVar19;
    if ((SBORROW8(0x7fffffffffffffff - lVar24,lVar19) != SBORROW8(lVar15,uVar9)) ==
        (long)(lVar15 - uVar9) < 0 || lVar24 < 0) {
      lVar15 = lVar24 + lVar19 + (ulong)CARRY8(uVar14,uVar6);
      if ((uVar23 + uVar12 & 0x3fffffffffffffff) != 0) goto LAB_001468bc;
      if ((uVar14 + uVar6 & 0x3fffffffffffffff) != 0) goto LAB_001468c1;
      uVar9 = uVar14 + uVar6 >> 0x3e | lVar15 * 4;
      uVar12 = uVar23 + uVar12 >> 0x3e | lVar20 * 4;
      lVar15 = lVar15 >> 0x3e;
      lVar20 = lVar20 >> 0x3e;
      if (iVar4 != 1) {
        psVar29 = (secp256k1_modinv64_signed62 *)((ulong)psVar29 & 0xffffffff);
        psVar13 = (secp256k1_modinv64_signed62 *)0x1;
        do {
          lVar24 = psVar34->v[(long)psVar13];
          uVar6 = lVar24 * lVar17 + uVar12;
          lVar31 = SUB168(SEXT816(lVar24) * SEXT816(lVar17),8) + lVar20 +
                   (ulong)CARRY8(lVar24 * lVar17,uVar12);
          lVar19 = extraout_RDX_09[(long)psVar13];
          uVar23 = lVar19 * lVar16;
          lVar20 = SUB168(SEXT816(lVar19) * SEXT816(lVar16),8);
          if (lVar20 < 0) {
            lVar32 = (-0x8000000000000000 - lVar20) - (ulong)(uVar23 != 0);
            lVar3 = lVar31 - lVar32;
            if ((SBORROW8(lVar31,lVar32) != SBORROW8(lVar3,(ulong)(uVar6 < -uVar23))) ==
                (long)(lVar3 - (ulong)(uVar6 < -uVar23)) < 0) goto LAB_001467a6;
LAB_001468ad:
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_001468b2:
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_001468b7;
          }
          uVar12 = (ulong)(-uVar23 - 1 < uVar6);
          lVar3 = (0x7fffffffffffffff - lVar20) - lVar31;
          if ((SBORROW8(0x7fffffffffffffff - lVar20,lVar31) != SBORROW8(lVar3,uVar12)) !=
              (long)(lVar3 - uVar12) < 0) goto LAB_001468ad;
LAB_001467a6:
          lVar20 = lVar31 + lVar20 + (ulong)CARRY8(uVar6,uVar23);
          uVar33 = lVar24 * lVar2 + uVar9;
          lVar24 = SUB168(SEXT816(lVar24) * SEXT816(lVar2),8) + lVar15 +
                   (ulong)CARRY8(lVar24 * lVar2,uVar9);
          uVar14 = lVar19 * lVar1;
          lVar15 = SUB168(SEXT816(lVar19) * SEXT816(lVar1),8);
          if (lVar15 < 0) {
            lVar31 = (-0x8000000000000000 - lVar15) - (ulong)(uVar14 != 0);
            lVar19 = lVar24 - lVar31;
            if ((SBORROW8(lVar24,lVar31) != SBORROW8(lVar19,(ulong)(uVar33 < -uVar14))) !=
                (long)(lVar19 - (ulong)(uVar33 < -uVar14)) < 0) goto LAB_001468b2;
          }
          else {
            uVar12 = (ulong)(-uVar14 - 1 < uVar33);
            lVar19 = (0x7fffffffffffffff - lVar15) - lVar24;
            if ((SBORROW8(0x7fffffffffffffff - lVar15,lVar24) != SBORROW8(lVar19,uVar12)) !=
                (long)(lVar19 - uVar12) < 0) goto LAB_001468b2;
          }
          lVar15 = lVar24 + lVar15 + (ulong)CARRY8(uVar33,uVar14);
          uVar12 = lVar20 * 4 | uVar6 + uVar23 >> 0x3e;
          psVar34->v[(long)((long)psVar13[-1].v + 0x27)] = uVar6 + uVar23 & 0x3fffffffffffffff;
          uVar9 = lVar15 * 4 | uVar33 + uVar14 >> 0x3e;
          extraout_RDX_09[(long)((long)psVar13[-1].v + 0x27)] = uVar33 + uVar14 & 0x3fffffffffffffff
          ;
          psVar13 = (secp256k1_modinv64_signed62 *)((long)psVar13->v + 1);
          lVar15 = lVar15 >> 0x3e;
          lVar20 = lVar20 >> 0x3e;
        } while (psVar29 != psVar13);
      }
      if (lVar20 + -1 + (ulong)(0x7fffffffffffffff < uVar12) != -1) goto LAB_001468c6;
      psVar34->v[(long)iVar4 + -1] = uVar12;
      if (lVar15 + -1 + (ulong)(0x7fffffffffffffff < uVar9) == -1) {
        extraout_RDX_09[(long)iVar4 + -1] = uVar9;
        return;
      }
      goto LAB_001468cb;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar17 = psVar29->v[0];
  lVar16 = psVar29->v[1];
  lVar15 = psVar29->v[2];
  lVar24 = psVar29->v[3];
  lVar2 = psVar29->v[4];
  lVar19 = 0;
  do {
    if (psVar29->v[lVar19] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_00146b06:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00146b0b;
    }
    if (0x3fffffffffffffff < psVar29->v[lVar19]) goto LAB_00146b06;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 5);
  iVar4 = secp256k1_modinv64_mul_cmp_62(psVar29,5,b,-2);
  if (iVar4 < 1) {
LAB_00146b0b:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00146b10:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_00146b15:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar4 = secp256k1_modinv64_mul_cmp_62(psVar29,5,b,1);
    if (-1 < iVar4) goto LAB_00146b10;
    uVar12 = lVar2 >> 0x3f;
    uVar6 = (long)psVar34 >> 0x3f;
    uVar23 = ((uVar12 & b->v[0]) + lVar17 ^ uVar6) - uVar6;
    uVar14 = ((long)uVar23 >> 0x3e) + (((uVar12 & b->v[1]) + lVar16 ^ uVar6) - uVar6);
    uVar33 = ((long)uVar14 >> 0x3e) + ((lVar15 + (uVar12 & b->v[2]) ^ uVar6) - uVar6);
    uVar9 = ((long)uVar33 >> 0x3e) + (((uVar12 & b->v[3]) + lVar24 ^ uVar6) - uVar6);
    lVar17 = ((long)uVar9 >> 0x3e) + (((uVar12 & b->v[4]) + lVar2 ^ uVar6) - uVar6);
    uVar6 = lVar17 >> 0x3f;
    uVar12 = (b->v[0] & uVar6) + (uVar23 & 0x3fffffffffffffff);
    uVar14 = ((long)uVar12 >> 0x3e) + (b->v[1] & uVar6) + (uVar14 & 0x3fffffffffffffff);
    uVar23 = ((long)uVar14 >> 0x3e) + (b->v[2] & uVar6) + (uVar33 & 0x3fffffffffffffff);
    uVar9 = ((long)uVar23 >> 0x3e) + (b->v[3] & uVar6) + (uVar9 & 0x3fffffffffffffff);
    uVar6 = (b->v[4] & uVar6) + lVar17 + ((long)uVar9 >> 0x3e);
    psVar29->v[0] = uVar12 & 0x3fffffffffffffff;
    psVar29->v[1] = uVar14 & 0x3fffffffffffffff;
    psVar29->v[2] = uVar23 & 0x3fffffffffffffff;
    psVar29->v[3] = uVar9 & 0x3fffffffffffffff;
    psVar29->v[4] = uVar6;
    if (0x3fffffffffffffff < uVar6) goto LAB_00146b15;
    iVar4 = secp256k1_modinv64_mul_cmp_62(psVar29,5,b,0);
    if (-1 < iVar4) {
      iVar4 = secp256k1_modinv64_mul_cmp_62(psVar29,5,b,1);
      if (iVar4 < 0) {
        return;
      }
      goto LAB_00146b1f;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00146b1f:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_scalar_from_signed62(secp256k1_scalar *r, const secp256k1_modinv64_signed62 *a) {
    const uint64_t a0 = a->v[0], a1 = a->v[1], a2 = a->v[2], a3 = a->v[3], a4 = a->v[4];

    /* The output from secp256k1_modinv64{_var} should be normalized to range [0,modulus), and
     * have limbs in [0,2^62). The modulus is < 2^256, so the top limb must be below 2^(256-62*4).
     */
    VERIFY_CHECK(a0 >> 62 == 0);
    VERIFY_CHECK(a1 >> 62 == 0);
    VERIFY_CHECK(a2 >> 62 == 0);
    VERIFY_CHECK(a3 >> 62 == 0);
    VERIFY_CHECK(a4 >> 8 == 0);

    r->d[0] = a0      | a1 << 62;
    r->d[1] = a1 >> 2 | a2 << 60;
    r->d[2] = a2 >> 4 | a3 << 58;
    r->d[3] = a3 >> 6 | a4 << 56;

#ifdef VERIFY
    VERIFY_CHECK(secp256k1_scalar_check_overflow(r) == 0);
#endif
}